

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  char cVar1;
  Column *pCVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  void *pvVar7;
  bool bVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  
  pCVar2 = this->m_column;
  uVar10 = this->m_stringIndex;
  pbVar3 = (pCVar2->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar10) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pyxll[P]xlfparser/tests/catch.hpp"
                  ,0x1913,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  uVar4 = this->m_pos;
  if ((uVar4 != 0 || uVar10 != 0) ||
     (sVar13 = pCVar2->m_initialIndent, sVar13 == 0xffffffffffffffff)) {
    sVar13 = pCVar2->m_indent;
  }
  sVar13 = pCVar2->m_width - sVar13;
  uVar5 = *(size_type *)((long)(pbVar3 + uVar10) + 8);
  this->m_end = uVar4;
  uVar11 = uVar4;
  if (uVar4 < uVar5) {
    lVar6 = *(long *)&pbVar3[uVar10]._M_dataplus;
    uVar10 = uVar4;
    do {
      uVar11 = uVar10;
      if (*(char *)(lVar6 + uVar10) == '\n') break;
      uVar10 = uVar10 + 1;
      this->m_end = uVar10;
      uVar11 = uVar5;
    } while (uVar5 != uVar10);
  }
  sVar12 = sVar13;
  if (uVar11 < sVar13 + uVar4) {
    sVar12 = uVar11 - uVar4;
    goto LAB_00143034;
  }
  for (; sVar12 != 0; sVar12 = sVar12 - 1) {
    bVar8 = isBoundary(this,this->m_pos + sVar12);
    if (bVar8) goto LAB_0014306e;
  }
  goto LAB_0014302a;
  while (sVar12 = sVar12 - 1, sVar12 != 0) {
LAB_0014306e:
    cVar1 = *(char *)((sVar12 - 1) +
                     *(long *)&(this->m_column->m_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                               _M_dataplus + this->m_pos);
    if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
      calcLength();
    }
    pvVar7 = isWhitespace(char)::chars_abi_cxx11_;
    if (((DAT_001c2500 == 0) ||
        (pvVar9 = memchr(isWhitespace(char)::chars_abi_cxx11_,(int)cVar1,DAT_001c2500),
        pvVar9 == (void *)0x0)) || ((long)pvVar9 - (long)pvVar7 == -1)) goto LAB_00143034;
  }
LAB_0014302a:
  this->m_suffix = true;
  sVar12 = sVar13 - 1;
LAB_00143034:
  this->m_len = sVar12;
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}